

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O0

int Maj_ManAddCnf(Maj_Man_t_conflict *p,int iMint)

{
  int iVar1;
  int iVar2;
  int Var;
  int iVar3;
  int iVar4;
  int iVar5;
  uint local_58;
  int local_54;
  int nLits_1;
  int pLits_1 [3];
  int nLits;
  int pLits [3];
  int iBaseSatVarJ;
  int iBaseSatVarI;
  int Value;
  int j;
  int n;
  int k;
  int i;
  int iMint_local;
  Maj_Man_t_conflict *p_local;
  
  iVar2 = Maj_ManValue(iMint,p->nVars);
  for (n = 0; n < p->nVars; n = n + 1) {
    p->VarVals[n + 2] = iMint >> ((byte)n & 0x1f) & 1;
  }
  sat_solver_setnvars(p->pSat,p->iVar + p->nNodes * 4);
  n = p->nVars + 2;
  do {
    if (p->nObjs <= n) {
      p->iVar = p->nNodes * 4 + p->iVar;
      return 1;
    }
    Var = p->iVar + ((n - p->nVars) + -2) * 4;
    for (j = 0; j < 3; j = j + 1) {
      for (iBaseSatVarI = 0; iBaseSatVarI < p->nObjs; iBaseSatVarI = iBaseSatVarI + 1) {
        if (p->VarMarks[n][j][iBaseSatVarI] != 0) {
          iVar4 = p->iVar;
          iVar1 = p->nVars;
          for (Value = 0; Value < 2; Value = Value + 1) {
            pLits_1[1] = 0;
            iVar3 = Abc_Var2Lit(p->VarMarks[n][j][iBaseSatVarI],1);
            pLits_1[(long)pLits_1[1] + 2] = iVar3;
            pLits_1[1] = pLits_1[1] + 1;
            iVar3 = Abc_Var2Lit(Var + j,Value);
            iVar5 = pLits_1[1] + 1;
            pLits_1[(long)pLits_1[1] + 2] = iVar3;
            pLits_1[1] = iVar5;
            if (iBaseSatVarI < p->nVars + 2) {
              if (p->VarVals[iBaseSatVarI] != Value) goto LAB_0070a28c;
            }
            else {
              iVar3 = Abc_Var2Lit(iVar4 + ((iBaseSatVarI - iVar1) + -2) * 4 + 3,
                                  (uint)((Value != 0 ^ 0xffU) & 1));
              pLits_1[(long)pLits_1[1] + 2] = iVar3;
              pLits_1[1] = pLits_1[1] + 1;
LAB_0070a28c:
              iVar3 = sat_solver_addclause(p->pSat,pLits_1 + 2,pLits_1 + (long)pLits_1[1] + 2);
              if (iVar3 == 0) {
                return 0;
              }
            }
          }
        }
      }
    }
    for (Value = 0; Value < 2; Value = Value + 1) {
      if ((n != p->nObjs + -1) || (Value != iVar2)) {
        for (j = 0; j < 3; j = j + 1) {
          if (j != 0) {
            local_54 = Abc_Var2Lit(Var,Value);
          }
          local_58 = (uint)(j != 0);
          if (j != 1) {
            iVar4 = Abc_Var2Lit(Var + 1,Value);
            (&local_54)[(int)local_58] = iVar4;
            local_58 = local_58 + 1;
          }
          if (j != 2) {
            iVar4 = Abc_Var2Lit(Var + 2,Value);
            (&local_54)[(int)local_58] = iVar4;
            local_58 = local_58 + 1;
          }
          if (n != p->nObjs + -1) {
            iVar4 = Abc_Var2Lit(Var + 3,(uint)((Value != 0 ^ 0xffU) & 1));
            (&local_54)[(int)local_58] = iVar4;
            local_58 = local_58 + 1;
          }
          if (3 < local_58) {
            __assert_fail("nLits <= 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                          ,0x1c5,"int Maj_ManAddCnf(Maj_Man_t *, int)");
          }
          iVar4 = sat_solver_addclause(p->pSat,&local_54,&local_54 + (int)local_58);
          if (iVar4 == 0) {
            return 0;
          }
        }
      }
    }
    n = n + 1;
  } while( true );
}

Assistant:

static int Maj_ManAddCnf( Maj_Man_t * p, int iMint )
{
    // save minterm values
    int i, k, n, j, Value = Maj_ManValue(iMint, p->nVars);
    for ( i = 0; i < p->nVars; i++ )
        p->VarVals[i+2] = (iMint >> i) & 1;
    sat_solver_setnvars( p->pSat, p->iVar + 4*p->nNodes );
    //printf( "Adding clauses for minterm %d.\n", iMint );
    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    {
        // fanin connectivity
        int iBaseSatVarI = p->iVar + 4*(i - p->nVars - 2);
        for ( k = 0; k < 3; k++ )
        {
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            {
                int iBaseSatVarJ = p->iVar + 4*(j - p->nVars - 2);
                for ( n = 0; n < 2; n++ )
                {
                    int pLits[3], nLits = 0;
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                    pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + k, n );
                    if ( j >= p->nVars + 2 )
                        pLits[nLits++] = Abc_Var2Lit( iBaseSatVarJ + 3, !n );
                    else if ( p->VarVals[j] == n )
                        continue;
                    if ( !sat_solver_addclause( p->pSat, pLits, pLits+nLits ) )
                        return 0;
                }
            }
        }
        // node functionality
        for ( n = 0; n < 2; n++ )
        {
            if ( i == p->nObjs - 1 && n == Value )
                continue;
            for ( k = 0; k < 3; k++ )
            {
                int pLits[3], nLits = 0;
                if ( k != 0 ) pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 0, n );
                if ( k != 1 ) pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 1, n );
                if ( k != 2 ) pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 2, n );
                if ( i != p->nObjs - 1 ) pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 3, !n );
                assert( nLits <= 3 );
                if ( !sat_solver_addclause( p->pSat, pLits, pLits+nLits ) )
                    return 0;
            }
        }
    }
    p->iVar += 4*p->nNodes;
    return 1;
}